

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O0

pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
__thiscall pstack::Dwarf::CFI::putFDEorCIE(CFI *this,DWARFReader *reader)

{
  bool bVar1;
  unsigned_long end_;
  type_conflict1 *ptVar2;
  DWARFReader *in_RDX;
  __uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>
  extraout_RDX;
  tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_> extraout_RDX_00;
  tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_> extraout_RDX_01;
  __uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> _Var3;
  pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_> pVar4;
  bool local_109;
  bool local_d9;
  undefined1 local_d8 [8];
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> fde;
  type *notAnFde;
  type_conflict1 *success;
  undefined1 local_90 [8];
  DWARFReader r2;
  _Self local_60;
  element_type *local_58;
  bool local_49;
  void *local_48;
  bool local_39;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Off nextoff;
  Off associatedCIE;
  size_t startOffset;
  DWARFReader *reader_local;
  CFI *this_local;
  
  startOffset = (size_t)in_RDX;
  reader_local = reader;
  this_local = this;
  associatedCIE = DWARFReader::getOffset(in_RDX);
  local_38._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       decodeCIEFDEHdr((CFI *)reader,(DWARFReader *)startOffset,(FIType)reader[1].off,&nextoff);
  if (local_38._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_39 = false;
    local_48 = (void *)0x0;
    std::pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
    ::pair<bool,_std::nullptr_t,_true>
              ((pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
                *)this,&local_39,&local_48);
    _Var3._M_t.
    super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
    super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
         (tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>)
         (tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>)
         extraout_RDX.
         super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>._M_t.
         super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
         super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
  }
  else if (nextoff == 0xffffffffffffffff) {
    putCIE((CFI *)reader,associatedCIE,(DWARFReader *)startOffset,(Addr)local_38._M_pi);
    DWARFReader::setOffset((DWARFReader *)startOffset,(Off)local_38._M_pi);
    local_49 = true;
    local_58 = (element_type *)0x0;
    std::pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
    ::pair<bool,_std::nullptr_t,_true>
              ((pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
                *)this,&local_49,&local_58);
    _Var3._M_t.
    super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
    super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
         (tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>)
         (tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
         super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
  }
  else {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_pstack::Dwarf::CIE,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>_>
         ::find((map<unsigned_long,_pstack::Dwarf::CIE,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>_>
                 *)&reader[1].end,&nextoff);
    r2._32_8_ = std::
                map<unsigned_long,_pstack::Dwarf::CIE,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>_>
                ::end((map<unsigned_long,_pstack::Dwarf::CIE,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>_>
                       *)&reader[1].end);
    bVar1 = std::operator==(&local_60,(_Self *)&r2.addrLen);
    if (bVar1) {
      std::shared_ptr<const_pstack::Reader>::shared_ptr
                ((shared_ptr<const_pstack::Reader> *)&stack0xffffffffffffff60,
                 (shared_ptr<const_pstack::Reader> *)reader);
      end_ = std::numeric_limits<unsigned_long>::max();
      DWARFReader::DWARFReader
                ((DWARFReader *)local_90,
                 (shared_ptr<const_pstack::Reader> *)&stack0xffffffffffffff60,nextoff,end_);
      std::shared_ptr<const_pstack::Reader>::~shared_ptr
                ((shared_ptr<const_pstack::Reader> *)&stack0xffffffffffffff60);
      putFDEorCIE((CFI *)&success,reader);
      ptVar2 = std::
               get<0ul,bool,std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>>
                         ((pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
                           *)&success);
      fde._M_t.super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>.
      _M_t.super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
      super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
           (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>
           )std::
            get<1ul,bool,std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>>
                      ((pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
                        *)&success);
      local_109 = false;
      if ((*ptVar2 & 1U) != 0) {
        local_109 = std::operator==((unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
                                     *)fde._M_t.
                                       super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>
                                       .super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>.
                                       _M_head_impl,(nullptr_t)0x0);
      }
      if (local_109 == false) {
        __assert_fail("success && notAnFde == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/dwarf_frame.cc"
                      ,0x7a,
                      "std::pair<bool, std::unique_ptr<FDE>> pstack::Dwarf::CFI::putFDEorCIE(DWARFReader &) const"
                     );
      }
      std::
      pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>::
      ~pair((pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
             *)&success);
      DWARFReader::~DWARFReader((DWARFReader *)local_90);
    }
    std::
    make_unique<pstack::Dwarf::FDE,pstack::Dwarf::CFI_const&,pstack::Dwarf::DWARFReader&,unsigned_long&,unsigned_long&>
              ((CFI *)local_d8,reader,(unsigned_long *)startOffset,&nextoff);
    DWARFReader::setOffset((DWARFReader *)startOffset,(Off)local_38._M_pi);
    local_d9 = true;
    std::pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
    ::
    pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_true>
              ((pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
                *)this,&local_d9,
               (unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)local_d8)
    ;
    std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>::~unique_ptr
              ((unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)local_d8)
    ;
    _Var3._M_t.
    super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
    super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
         (tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>)
         (tuple<pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
         super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
  }
  pVar4.second._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
  super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       _Var3._M_t.
       super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
       super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
  pVar4._0_8_ = this;
  return pVar4;
}

Assistant:

std::pair<bool, std::unique_ptr<FDE>>
CFI::putFDEorCIE( DWARFReader &reader ) const {
   size_t startOffset = reader.getOffset();
   Elf::Off associatedCIE;
   Elf::Off nextoff = decodeCIEFDEHdr(reader, type, &associatedCIE);
   if (nextoff == 0)
      return { false, nullptr };
   if (associatedCIE == Elf::Off(-1)) {
      putCIE(startOffset, reader, nextoff);
      reader.setOffset( nextoff );
      return { true, nullptr };
   } else {
      if (cies.find(associatedCIE) == cies.end()) {
         DWARFReader r2( io, associatedCIE );
         auto [ success, notAnFde ] = putFDEorCIE(r2);
         assert(success && notAnFde == nullptr);
      }
      std::unique_ptr<FDE> fde = std::make_unique<FDE>(*this, reader, associatedCIE, nextoff);
      reader.setOffset( nextoff );
      return {true, std::move(fde) };
   }
}